

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

void __thiscall
Json::BuiltStyledStreamWriter::BuiltStyledStreamWriter
          (BuiltStyledStreamWriter *this,String *indentation,Enum cs,String *colonSymbol,
          String *nullSymbol,String *endingLineFeedSymbol,bool useSpecialFloats,bool emitUTF8,
          uint precision,PrecisionType precisionType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_StreamWriter).sout_ = (OStream *)0x0;
  (this->super_StreamWriter)._vptr_StreamWriter =
       (_func_int **)&PTR__BuiltStyledStreamWriter_00150cc0;
  (this->childValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->childValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->childValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->indentString_)._M_dataplus._M_p = (pointer)&(this->indentString_).field_2;
  (this->indentString_)._M_string_length = 0;
  (this->indentString_).field_2._M_local_buf[0] = '\0';
  this->rightMargin_ = 0x4a;
  paVar2 = &(this->indentation_).field_2;
  (this->indentation_)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (indentation->_M_dataplus)._M_p;
  paVar1 = &indentation->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&indentation->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->indentation_).field_2 + 8) = uVar4;
  }
  else {
    (this->indentation_)._M_dataplus._M_p = pcVar3;
    (this->indentation_).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->indentation_)._M_string_length = indentation->_M_string_length;
  (indentation->_M_dataplus)._M_p = (pointer)paVar1;
  indentation->_M_string_length = 0;
  (indentation->field_2)._M_local_buf[0] = '\0';
  this->cs_ = cs;
  paVar1 = &(this->colonSymbol_).field_2;
  (this->colonSymbol_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (colonSymbol->_M_dataplus)._M_p;
  paVar2 = &colonSymbol->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&colonSymbol->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->colonSymbol_).field_2 + 8) = uVar4;
  }
  else {
    (this->colonSymbol_)._M_dataplus._M_p = pcVar3;
    (this->colonSymbol_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->colonSymbol_)._M_string_length = colonSymbol->_M_string_length;
  (colonSymbol->_M_dataplus)._M_p = (pointer)paVar2;
  colonSymbol->_M_string_length = 0;
  (colonSymbol->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->nullSymbol_).field_2;
  (this->nullSymbol_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (nullSymbol->_M_dataplus)._M_p;
  paVar2 = &nullSymbol->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&nullSymbol->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->nullSymbol_).field_2 + 8) = uVar4;
  }
  else {
    (this->nullSymbol_)._M_dataplus._M_p = pcVar3;
    (this->nullSymbol_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->nullSymbol_)._M_string_length = nullSymbol->_M_string_length;
  (nullSymbol->_M_dataplus)._M_p = (pointer)paVar2;
  nullSymbol->_M_string_length = 0;
  (nullSymbol->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->endingLineFeedSymbol_).field_2;
  (this->endingLineFeedSymbol_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (endingLineFeedSymbol->_M_dataplus)._M_p;
  paVar2 = &endingLineFeedSymbol->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&endingLineFeedSymbol->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->endingLineFeedSymbol_).field_2 + 8) = uVar4;
  }
  else {
    (this->endingLineFeedSymbol_)._M_dataplus._M_p = pcVar3;
    (this->endingLineFeedSymbol_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->endingLineFeedSymbol_)._M_string_length = endingLineFeedSymbol->_M_string_length;
  (endingLineFeedSymbol->_M_dataplus)._M_p = (pointer)paVar2;
  endingLineFeedSymbol->_M_string_length = 0;
  (endingLineFeedSymbol->field_2)._M_local_buf[0] = '\0';
  this->field_0xd8 = emitUTF8 << 3 | useSpecialFloats << 2 | this->field_0xd8 & 0xf0;
  this->precision_ = precision;
  this->precisionType_ = precisionType;
  return;
}

Assistant:

BuiltStyledStreamWriter::BuiltStyledStreamWriter(
    String indentation, CommentStyle::Enum cs, String colonSymbol,
    String nullSymbol, String endingLineFeedSymbol, bool useSpecialFloats,
    bool emitUTF8, unsigned int precision, PrecisionType precisionType)
    : rightMargin_(74), indentation_(std::move(indentation)), cs_(cs),
      colonSymbol_(std::move(colonSymbol)), nullSymbol_(std::move(nullSymbol)),
      endingLineFeedSymbol_(std::move(endingLineFeedSymbol)),
      addChildValues_(false), indented_(false),
      useSpecialFloats_(useSpecialFloats), emitUTF8_(emitUTF8),
      precision_(precision), precisionType_(precisionType) {}